

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_aggregate.cpp
# Opt level: O3

void __thiscall
duckdb::HashAggregateDistinctFinalizeTask::~HashAggregateDistinctFinalizeTask
          (HashAggregateDistinctFinalizeTask *this)

{
  _Head_base<0UL,_duckdb::LocalSourceState_*,_false> _Var1;
  _Head_base<0UL,_duckdb::LocalSinkState_*,_false> _Var2;
  
  (this->super_ExecutorTask).super_Task._vptr_Task =
       (_func_int **)&PTR__HashAggregateDistinctFinalizeTask_02465f68;
  _Var1._M_head_impl =
       (this->radix_table_lstate).
       super_unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LocalSourceState_*,_std::default_delete<duckdb::LocalSourceState>_>
       .super__Head_base<0UL,_duckdb::LocalSourceState_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (LocalSourceState *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_LocalSourceState[1])();
  }
  (this->radix_table_lstate).
  super_unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>._M_t.
  super___uniq_ptr_impl<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::LocalSourceState_*,_std::default_delete<duckdb::LocalSourceState>_>
  .super__Head_base<0UL,_duckdb::LocalSourceState_*,_false>._M_head_impl = (LocalSourceState *)0x0;
  _Var2._M_head_impl =
       (this->local_sink_state).
       super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t.
       super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>
       .super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (LocalSinkState *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_LocalSinkState + 8))();
  }
  (this->local_sink_state).
  super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t.
  super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>.
  super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl = (LocalSinkState *)0x0;
  ExecutorTask::~ExecutorTask(&this->super_ExecutorTask);
  operator_delete(this);
  return;
}

Assistant:

HashAggregateDistinctFinalizeTask(Pipeline &pipeline, shared_ptr<Event> event_p, const PhysicalHashAggregate &op,
	                                  HashAggregateGlobalSinkState &state_p)
	    : ExecutorTask(pipeline.executor, std::move(event_p)), pipeline(pipeline), op(op), gstate(state_p) {
	}